

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwizard.cpp
# Opt level: O3

void QWizard::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  QFlagsStorage<QWizard::WizardOption> *pQVar3;
  undefined4 uVar4;
  int iVar5;
  QWizardPrivate *this;
  long in_FS_OFFSET;
  undefined4 local_1c;
  void *local_18;
  undefined4 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    break;
  case ReadProperty:
    if ((uint)_id < 6) {
      switch(_id) {
      case 0:
        uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 900);
        break;
      case 1:
        uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x388);
        break;
      case 2:
        uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x3b8);
        break;
      case 3:
        uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x3bc);
        break;
      case 4:
        uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x338);
        break;
      case 5:
        uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x340);
      }
      *(undefined4 *)*_a = uVar4;
    }
    goto switchD_0050f5ab_caseD_3;
  case WriteProperty:
    if (5 < (uint)_id) goto switchD_0050f5ab_caseD_3;
    pQVar3 = (QFlagsStorage<QWizard::WizardOption> *)*_a;
    switch(_id) {
    case 0:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setWizardStyle((QWizard *)_o,pQVar3->i);
        return;
      }
      break;
    case 1:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setOptions((QWizard *)_o,(WizardOptions)pQVar3->i);
        return;
      }
      break;
    case 2:
      this = *(QWizardPrivate **)(_o + 8);
      this->titleFmt = pQVar3->i;
      goto LAB_0050f700;
    case 3:
      this = *(QWizardPrivate **)(_o + 8);
      this->subTitleFmt = pQVar3->i;
LAB_0050f700:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QWizardPrivate::updateLayout(this);
        return;
      }
      break;
    case 4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        setStartId((QWizard *)_o,pQVar3->i);
        return;
      }
      break;
    case 5:
      goto switchD_0050f611_caseD_5;
    }
    goto LAB_0050f958;
  default:
    goto switchD_0050f5ab_caseD_3;
  case IndexOfMethod:
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == currentIdChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == helpRequested && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == customButtonClicked && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == pageAdded && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == pageRemoved && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    goto switchD_0050f5ab_caseD_3;
  }
  switch(_id) {
  case 0:
    local_1c = *_a[1];
    iVar5 = 0;
    goto LAB_0050f866;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QMetaObject::activate(_o,&staticMetaObject,1,(void **)0x0);
      return;
    }
    break;
  case 2:
    local_1c = *_a[1];
    iVar5 = 2;
    goto LAB_0050f866;
  case 3:
    local_1c = *_a[1];
    iVar5 = 3;
    goto LAB_0050f866;
  case 4:
    local_1c = *_a[1];
    iVar5 = 4;
LAB_0050f866:
    local_10 = &local_1c;
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_18);
switchD_0050f5ab_caseD_3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      back((QWizard *)_o);
      return;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      next((QWizard *)_o);
      return;
    }
    break;
  case 7:
    pQVar3 = (QFlagsStorage<QWizard::WizardOption> *)_a[1];
switchD_0050f611_caseD_5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      setCurrentId((QWizard *)_o,pQVar3->i);
      return;
    }
    break;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      restart((QWizard *)_o);
      return;
    }
    break;
  case 9:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QWizardPrivate::_q_emitCustomButtonClicked(*(QWizardPrivate **)(_o + 8));
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QWizardPrivate::_q_updateButtonStates(*(QWizardPrivate **)(_o + 8));
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QWizardPrivate::_q_handleFieldObjectDestroyed(*(QWizardPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  default:
    goto switchD_0050f5ab_caseD_3;
  }
LAB_0050f958:
  __stack_chk_fail();
}

Assistant:

void QWizard::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWizard *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentIdChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->helpRequested(); break;
        case 2: _t->customButtonClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->pageAdded((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->pageRemoved((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 5: _t->back(); break;
        case 6: _t->next(); break;
        case 7: _t->setCurrentId((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 8: _t->restart(); break;
        case 9: _t->d_func()->_q_emitCustomButtonClicked(); break;
        case 10: _t->d_func()->_q_updateButtonStates(); break;
        case 11: _t->d_func()->_q_handleFieldObjectDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::currentIdChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)()>(_a, &QWizard::helpRequested, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::customButtonClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::pageAdded, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QWizard::*)(int )>(_a, &QWizard::pageRemoved, 4))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<WizardStyle*>(_v) = _t->wizardStyle(); break;
        case 1: QtMocHelpers::assignFlags<WizardOptions>(_v, _t->options()); break;
        case 2: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->titleFormat(); break;
        case 3: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->subTitleFormat(); break;
        case 4: *reinterpret_cast<int*>(_v) = _t->startId(); break;
        case 5: *reinterpret_cast<int*>(_v) = _t->currentId(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setWizardStyle(*reinterpret_cast<WizardStyle*>(_v)); break;
        case 1: _t->setOptions(*reinterpret_cast<WizardOptions*>(_v)); break;
        case 2: _t->setTitleFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 3: _t->setSubTitleFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 4: _t->setStartId(*reinterpret_cast<int*>(_v)); break;
        case 5: _t->setCurrentId(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}